

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void write_color(ostream *out,color *pixel_color)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  char local_23 [3];
  double local_20;
  
  dVar5 = pixel_color->e[0];
  dVar2 = pixel_color->e[1];
  dVar3 = pixel_color->e[2];
  dVar4 = 0.0;
  if (0.0 < dVar5) {
    if (dVar5 < 0.0) {
      dVar4 = sqrt(dVar5);
    }
    else {
      dVar4 = SQRT(dVar5);
    }
  }
  dVar5 = 0.0;
  if (0.0 < dVar2) {
    if (dVar2 < 0.0) {
      dVar5 = sqrt(dVar2);
    }
    else {
      dVar5 = SQRT(dVar2);
    }
  }
  dVar2 = 0.0;
  if (0.0 < dVar3) {
    if (dVar3 < 0.0) {
      dVar2 = sqrt(dVar3);
    }
    else {
      dVar2 = SQRT(dVar3);
    }
  }
  if (write_color(std::ostream&,vec3_const&)::intensity == '\0') {
    local_20 = dVar2;
    write_color();
    dVar2 = local_20;
  }
  dVar3 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar4) &&
     (dVar3 = write_color::intensity.max, dVar4 <= write_color::intensity.max)) {
    dVar3 = dVar4;
  }
  dVar4 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar5) &&
     (dVar4 = write_color::intensity.max, dVar5 <= write_color::intensity.max)) {
    dVar4 = dVar5;
  }
  dVar5 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar2) &&
     (dVar5 = write_color::intensity.max, dVar2 <= write_color::intensity.max)) {
    dVar5 = dVar2;
  }
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)out,(int)(dVar3 * 256.0));
  local_23[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_23,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)(dVar4 * 256.0));
  local_23[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_23 + 1,1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)(dVar5 * 256.0));
  local_23[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_23 + 2,1);
  return;
}

Assistant:

void write_color(std::ostream& out, const color& pixel_color) {
    auto r = pixel_color.x();
    auto g = pixel_color.y();
    auto b = pixel_color.z();

    // Apply a linear to gamma transform for gamma 2
    r = linear_to_gamma(r);
    g = linear_to_gamma(g);
    b = linear_to_gamma(b);

    // Translate the [0,1] component values to the byte range [0,255].
    static const interval intensity(0.000, 0.999);
    int rbyte = int(256 * intensity.clamp(r));
    int gbyte = int(256 * intensity.clamp(g));
    int bbyte = int(256 * intensity.clamp(b));

    // Write out the pixel color components.
    out << rbyte << ' ' << gbyte << ' ' << bbyte << '\n';
}